

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::
     format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
               (ostream *out,char *fmt,basic_string_view<char,_std::char_traits<char>_> *args,
               basic_string_view<char,_std::char_traits<char>_> *args_1,int *args_2,
               basic_string_view<char,_std::char_traits<char>_> *args_3,char (*args_4) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               char (*args_6) [42])

{
  long in_FS_OFFSET;
  FormatArg local_c0;
  basic_string_view<char,_std::char_traits<char>_> *local_a8;
  code *local_a0;
  code *local_98;
  int *local_90;
  code *local_88;
  code *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  code *local_70;
  code *local_68;
  char (*local_60) [13];
  code *local_58;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  code *local_40;
  code *local_38;
  char (*local_30) [42];
  code *local_28;
  code *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0.m_formatImpl =
       detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_c0.m_toIntImpl =
       detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_a0 = detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_98 = detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_88 = detail::FormatArg::formatImpl<int>;
  local_80 = detail::FormatArg::toIntImpl<int>;
  local_70 = detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_68 = detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_60 = args_4;
  local_58 = detail::FormatArg::formatImpl<char[13]>;
  local_50 = detail::FormatArg::toIntImpl<char[13]>;
  local_48 = args_5;
  local_40 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_38 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_30 = args_6;
  local_28 = detail::FormatArg::formatImpl<char[42]>;
  local_20 = detail::FormatArg::toIntImpl<char[42]>;
  local_c0.m_value = args;
  local_a8 = args_1;
  local_90 = args_2;
  local_78 = args_3;
  detail::formatImpl(out,fmt,&local_c0,7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}